

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O1

void dct2_butterfly_h32_avx2(s16 *src,int i_src,s16 *dst,int line,int shift,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  int iVar32;
  int iVar33;
  ulong uVar34;
  undefined2 uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  short sVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  __m256i min_val;
  __m256i max_val;
  undefined1 local_548 [32];
  undefined1 local_528 [32];
  undefined1 local_508 [32];
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [32];
  
  iVar32 = 1 << ((char)shift - 1U & 0x1f);
  if (0 < line) {
    iVar33 = 1 << ((byte)bit_depth & 0x1f);
    sVar39 = -(short)iVar33;
    uVar35 = (undefined2)(iVar33 + -1);
    uVar34 = 0;
    do {
      auVar8 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)i_src + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 3) + uVar34));
      auVar49 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)i_src + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 3) + uVar34));
      auVar9 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 5) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 7) + uVar34));
      auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 5) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 7) + uVar34));
      auVar10 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 9) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0xb) + uVar34));
      auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 9) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xb) + uVar34));
      auVar11 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0xd) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0xf) + uVar34));
      auVar3 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0xd) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xf) + uVar34));
      auVar12 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x11) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x13) + uVar34));
      auVar4 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x11) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x13) + uVar34));
      auVar13 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x15) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x17) + uVar34));
      auVar5 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x15) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x17) + uVar34));
      auVar14 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x19) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x1b) + uVar34));
      auVar6 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x19) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x1b) + uVar34));
      auVar15 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x1d) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x1f) + uVar34));
      auVar7 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x1d) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x1f) + uVar34));
      auVar55._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar8;
      auVar55._16_16_ = ZEXT116(1) * auVar49;
      auVar16._8_2_ = 0x2d;
      auVar16._0_8_ = 0x2d002d002d002d;
      auVar16._10_2_ = 0x2d;
      auVar16._12_2_ = 0x2d;
      auVar16._14_2_ = 0x2d;
      auVar16._16_2_ = 0x2d;
      auVar16._18_2_ = 0x2d;
      auVar16._20_2_ = 0x2d;
      auVar16._22_2_ = 0x2d;
      auVar16._24_2_ = 0x2d;
      auVar16._26_2_ = 0x2d;
      auVar16._28_2_ = 0x2d;
      auVar16._30_2_ = 0x2d;
      auVar54 = vpmaddwd_avx2(auVar55,auVar16);
      auVar57._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar9;
      auVar57._16_16_ = ZEXT116(1) * auVar1;
      auVar46 = vpmaddwd_avx2(auVar57,_DAT_0017f780);
      auVar54 = vpaddd_avx2(auVar46,auVar54);
      auVar47._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar10;
      auVar47._16_16_ = ZEXT116(1) * auVar2;
      auVar46 = vpmaddwd_avx2(auVar47,_DAT_0017f7a0);
      auVar48._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar11;
      auVar48._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
      auVar52 = vpmaddwd_avx2(auVar48,_DAT_0017f7c0);
      auVar46 = vpaddd_avx2(auVar46,auVar52);
      auVar54 = vpaddd_avx2(auVar54,auVar46);
      auVar41._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar12;
      auVar41._16_16_ = ZEXT116(1) * auVar4;
      auVar46 = vpmaddwd_avx2(auVar41,_DAT_0017f7e0);
      auVar36._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar13;
      auVar36._16_16_ = ZEXT116(1) * auVar5;
      auVar52 = vpmaddwd_avx2(auVar36,_DAT_0017f800);
      auVar46 = vpaddd_avx2(auVar46,auVar52);
      auVar50._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar14;
      auVar50._16_16_ = ZEXT116(1) * auVar6;
      auVar52 = vpmaddwd_avx2(auVar50,_DAT_0017f820);
      auVar46 = vpaddd_avx2(auVar46,auVar52);
      auVar54 = vpaddd_avx2(auVar54,auVar46);
      auVar51._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar15;
      auVar51._16_16_ = ZEXT116(1) * auVar7;
      auVar46 = vpmaddwd_avx2(auVar51,_DAT_0017f840);
      auVar54 = vpaddd_avx2(auVar54,auVar46);
      auVar46 = vpmaddwd_avx2(auVar55,_DAT_0017f860);
      auVar52 = vpmaddwd_avx2(auVar57,_DAT_0017f880);
      auVar46 = vpaddd_avx2(auVar52,auVar46);
      auVar52 = vpmaddwd_avx2(auVar47,_DAT_0017f8a0);
      auVar58 = vpmaddwd_avx2(auVar48,_DAT_0017f8c0);
      auVar52 = vpaddd_avx2(auVar52,auVar58);
      auVar46 = vpaddd_avx2(auVar46,auVar52);
      auVar52 = vpmaddwd_avx2(auVar41,_DAT_0017f8e0);
      auVar58 = vpmaddwd_avx2(auVar36,_DAT_0017f900);
      auVar52 = vpaddd_avx2(auVar52,auVar58);
      auVar58 = vpmaddwd_avx2(auVar50,_DAT_0017f920);
      auVar52 = vpaddd_avx2(auVar52,auVar58);
      auVar46 = vpaddd_avx2(auVar46,auVar52);
      auVar52 = vpmaddwd_avx2(auVar51,_DAT_0017f940);
      auVar46 = vpaddd_avx2(auVar46,auVar52);
      auVar52 = vpmaddwd_avx2(auVar55,_DAT_0017f960);
      auVar58 = vpmaddwd_avx2(auVar57,_DAT_0017f980);
      auVar52 = vpaddd_avx2(auVar58,auVar52);
      auVar58 = vpmaddwd_avx2(auVar47,_DAT_0017f9a0);
      auVar56 = vpmaddwd_avx2(auVar48,_DAT_0017f9c0);
      auVar58 = vpaddd_avx2(auVar58,auVar56);
      auVar52 = vpaddd_avx2(auVar52,auVar58);
      auVar58 = vpmaddwd_avx2(auVar41,_DAT_0017f9e0);
      auVar56 = vpmaddwd_avx2(auVar36,_DAT_0017fa00);
      auVar58 = vpaddd_avx2(auVar58,auVar56);
      auVar28._8_4_ = 0x2b002d;
      auVar28._0_8_ = 0x2b002d002b002d;
      auVar28._12_4_ = 0x2b002d;
      auVar28._16_4_ = 0x2b002d;
      auVar28._20_4_ = 0x2b002d;
      auVar28._24_4_ = 0x2b002d;
      auVar28._28_4_ = 0x2b002d;
      auVar56 = vpmaddwd_avx2(auVar28,auVar50);
      auVar58 = vpaddd_avx2(auVar58,auVar56);
      auVar52 = vpaddd_avx2(auVar52,auVar58);
      auVar58 = vpmaddwd_avx2(auVar51,_DAT_0017fa20);
      auVar52 = vpaddd_avx2(auVar52,auVar58);
      auVar58 = vpmaddwd_avx2(auVar55,_DAT_0017fa40);
      auVar56 = vpmaddwd_avx2(auVar57,_DAT_0017fa60);
      auVar58 = vpaddd_avx2(auVar56,auVar58);
      auVar56 = vpmaddwd_avx2(auVar47,_DAT_0017fa80);
      auVar16 = vpmaddwd_avx2(auVar48,_DAT_0017faa0);
      auVar56 = vpaddd_avx2(auVar56,auVar16);
      auVar58 = vpaddd_avx2(auVar58,auVar56);
      auVar56 = vpmaddwd_avx2(auVar41,_DAT_0017fac0);
      auVar16 = vpmaddwd_avx2(auVar36,_DAT_0017fae0);
      auVar56 = vpaddd_avx2(auVar56,auVar16);
      auVar16 = vpmaddwd_avx2(auVar50,_DAT_0017fb00);
      auVar56 = vpaddd_avx2(auVar56,auVar16);
      auVar58 = vpaddd_avx2(auVar58,auVar56);
      auVar56 = vpmaddwd_avx2(auVar51,_DAT_0017fb20);
      auVar58 = vpaddd_avx2(auVar58,auVar56);
      auVar56 = vpmaddwd_avx2(auVar55,_DAT_0017fb40);
      auVar16 = vpmaddwd_avx2(auVar57,_DAT_0017fb60);
      auVar56 = vpaddd_avx2(auVar16,auVar56);
      auVar16 = vpmaddwd_avx2(auVar47,_DAT_0017fb80);
      auVar17 = vpmaddwd_avx2(auVar48,_DAT_0017fba0);
      auVar16 = vpaddd_avx2(auVar16,auVar17);
      auVar56 = vpaddd_avx2(auVar56,auVar16);
      auVar16 = vpmaddwd_avx2(auVar41,_DAT_0017fbc0);
      auVar17 = vpmaddwd_avx2(auVar36,_DAT_0017fbe0);
      auVar16 = vpaddd_avx2(auVar16,auVar17);
      auVar17 = vpmaddwd_avx2(auVar50,_DAT_0017fc00);
      auVar16 = vpaddd_avx2(auVar16,auVar17);
      auVar56 = vpaddd_avx2(auVar56,auVar16);
      auVar16 = vpmaddwd_avx2(auVar51,_DAT_0017fc20);
      auVar56 = vpaddd_avx2(auVar56,auVar16);
      auVar16 = vpmaddwd_avx2(auVar55,_DAT_0017fc40);
      auVar17 = vpmaddwd_avx2(auVar57,_DAT_0017fc60);
      auVar16 = vpaddd_avx2(auVar17,auVar16);
      auVar17 = vpmaddwd_avx2(auVar47,_DAT_0017fc80);
      auVar18 = vpmaddwd_avx2(auVar48,_DAT_0017fca0);
      auVar17 = vpaddd_avx2(auVar17,auVar18);
      auVar16 = vpaddd_avx2(auVar16,auVar17);
      auVar17 = vpmaddwd_avx2(auVar41,_DAT_0017fcc0);
      auVar18 = vpmaddwd_avx2(auVar36,_DAT_0017fce0);
      auVar17 = vpaddd_avx2(auVar17,auVar18);
      auVar18 = vpmaddwd_avx2(auVar50,_DAT_0017fd00);
      auVar17 = vpaddd_avx2(auVar17,auVar18);
      auVar16 = vpaddd_avx2(auVar16,auVar17);
      auVar17 = vpmaddwd_avx2(auVar51,_DAT_0017fd20);
      auVar16 = vpaddd_avx2(auVar16,auVar17);
      auVar17 = vpmaddwd_avx2(auVar55,_DAT_0017fd40);
      auVar18 = vpmaddwd_avx2(auVar57,_DAT_0017fd60);
      auVar17 = vpaddd_avx2(auVar18,auVar17);
      auVar18 = vpmaddwd_avx2(auVar47,_DAT_0017fd80);
      auVar19 = vpmaddwd_avx2(auVar48,_DAT_0017fda0);
      auVar18 = vpaddd_avx2(auVar18,auVar19);
      auVar17 = vpaddd_avx2(auVar17,auVar18);
      auVar18 = vpmaddwd_avx2(auVar41,_DAT_0017fdc0);
      auVar19 = vpmaddwd_avx2(auVar36,_DAT_0017fde0);
      auVar18 = vpaddd_avx2(auVar18,auVar19);
      auVar19 = vpmaddwd_avx2(auVar50,_DAT_0017fe00);
      auVar18 = vpaddd_avx2(auVar18,auVar19);
      auVar17 = vpaddd_avx2(auVar17,auVar18);
      auVar18 = vpmaddwd_avx2(auVar51,_DAT_0017fe20);
      auVar17 = vpaddd_avx2(auVar17,auVar18);
      auVar18 = vpmaddwd_avx2(auVar55,_DAT_0017fe40);
      auVar19 = vpmaddwd_avx2(auVar57,_DAT_0017fe60);
      auVar18 = vpaddd_avx2(auVar19,auVar18);
      auVar19 = vpmaddwd_avx2(auVar47,_DAT_0017fe80);
      auVar20 = vpmaddwd_avx2(auVar48,_DAT_0017fea0);
      auVar19 = vpaddd_avx2(auVar19,auVar20);
      auVar18 = vpaddd_avx2(auVar18,auVar19);
      auVar19 = vpmaddwd_avx2(auVar41,_DAT_0017fec0);
      auVar20 = vpmaddwd_avx2(auVar36,_DAT_0017fee0);
      auVar19 = vpaddd_avx2(auVar19,auVar20);
      auVar20 = vpmaddwd_avx2(auVar50,_DAT_0017ff00);
      auVar19 = vpaddd_avx2(auVar19,auVar20);
      auVar18 = vpaddd_avx2(auVar18,auVar19);
      auVar19 = vpmaddwd_avx2(auVar51,_DAT_0017ff20);
      auVar18 = vpaddd_avx2(auVar18,auVar19);
      auVar19 = vpmaddwd_avx2(auVar55,_DAT_0017ff40);
      auVar20 = vpmaddwd_avx2(auVar57,_DAT_0017ff60);
      auVar19 = vpaddd_avx2(auVar20,auVar19);
      auVar20 = vpmaddwd_avx2(auVar47,_DAT_0017ff80);
      auVar21 = vpmaddwd_avx2(auVar48,_DAT_0017ffa0);
      auVar20 = vpaddd_avx2(auVar20,auVar21);
      auVar19 = vpaddd_avx2(auVar19,auVar20);
      auVar20 = vpmaddwd_avx2(auVar41,_DAT_0017ffc0);
      auVar21 = vpmaddwd_avx2(auVar36,_DAT_0017ffe0);
      auVar20 = vpaddd_avx2(auVar20,auVar21);
      auVar21 = vpmaddwd_avx2(auVar50,_DAT_00180000);
      auVar20 = vpaddd_avx2(auVar20,auVar21);
      auVar19 = vpaddd_avx2(auVar19,auVar20);
      auVar20 = vpmaddwd_avx2(auVar51,_DAT_00180020);
      auVar19 = vpaddd_avx2(auVar19,auVar20);
      auVar20 = vpmaddwd_avx2(auVar55,_DAT_00180040);
      auVar21 = vpmaddwd_avx2(auVar57,_DAT_00180060);
      auVar20 = vpaddd_avx2(auVar21,auVar20);
      auVar21 = vpmaddwd_avx2(auVar47,_DAT_00180080);
      auVar22 = vpmaddwd_avx2(auVar48,_DAT_001800a0);
      auVar21 = vpaddd_avx2(auVar21,auVar22);
      auVar20 = vpaddd_avx2(auVar20,auVar21);
      auVar21 = vpmaddwd_avx2(auVar41,_DAT_001800c0);
      auVar22 = vpmaddwd_avx2(auVar36,_DAT_001800e0);
      auVar21 = vpaddd_avx2(auVar21,auVar22);
      auVar22 = vpmaddwd_avx2(auVar50,_DAT_00180100);
      auVar21 = vpaddd_avx2(auVar21,auVar22);
      auVar20 = vpaddd_avx2(auVar20,auVar21);
      auVar21 = vpmaddwd_avx2(auVar51,_DAT_00180120);
      auVar20 = vpaddd_avx2(auVar20,auVar21);
      auVar21 = vpmaddwd_avx2(auVar55,_DAT_00180140);
      auVar22 = vpmaddwd_avx2(auVar57,_DAT_00180160);
      auVar21 = vpaddd_avx2(auVar22,auVar21);
      auVar22 = vpmaddwd_avx2(auVar47,_DAT_00180180);
      auVar23 = vpmaddwd_avx2(auVar48,_DAT_001801a0);
      auVar22 = vpaddd_avx2(auVar22,auVar23);
      auVar21 = vpaddd_avx2(auVar21,auVar22);
      auVar22 = vpmaddwd_avx2(auVar41,_DAT_001801c0);
      auVar23 = vpmaddwd_avx2(auVar36,_DAT_001801e0);
      auVar22 = vpaddd_avx2(auVar22,auVar23);
      auVar23 = vpmaddwd_avx2(auVar50,_DAT_00180200);
      auVar22 = vpaddd_avx2(auVar22,auVar23);
      auVar21 = vpaddd_avx2(auVar21,auVar22);
      auVar22 = vpmaddwd_avx2(auVar51,_DAT_00180220);
      auVar21 = vpaddd_avx2(auVar21,auVar22);
      auVar22 = vpmaddwd_avx2(auVar55,_DAT_00180240);
      auVar23 = vpmaddwd_avx2(auVar57,_DAT_00180260);
      auVar22 = vpaddd_avx2(auVar23,auVar22);
      auVar23 = vpmaddwd_avx2(auVar47,_DAT_00180280);
      auVar24 = vpmaddwd_avx2(auVar48,_DAT_001802a0);
      auVar23 = vpaddd_avx2(auVar23,auVar24);
      auVar22 = vpaddd_avx2(auVar22,auVar23);
      auVar23 = vpmaddwd_avx2(auVar41,_DAT_001802c0);
      auVar24 = vpmaddwd_avx2(auVar36,_DAT_001802e0);
      auVar23 = vpaddd_avx2(auVar23,auVar24);
      auVar24 = vpmaddwd_avx2(auVar50,_DAT_00180300);
      auVar23 = vpaddd_avx2(auVar23,auVar24);
      auVar22 = vpaddd_avx2(auVar22,auVar23);
      auVar23 = vpmaddwd_avx2(auVar51,_DAT_00180320);
      auVar22 = vpaddd_avx2(auVar22,auVar23);
      auVar23 = vpmaddwd_avx2(auVar55,_DAT_00180340);
      auVar24 = vpmaddwd_avx2(auVar57,_DAT_00180360);
      auVar23 = vpaddd_avx2(auVar24,auVar23);
      auVar24 = vpmaddwd_avx2(auVar47,_DAT_00180380);
      auVar25 = vpmaddwd_avx2(auVar48,_DAT_001803a0);
      auVar24 = vpaddd_avx2(auVar24,auVar25);
      auVar23 = vpaddd_avx2(auVar23,auVar24);
      auVar24 = vpmaddwd_avx2(auVar41,_DAT_001803c0);
      auVar25 = vpmaddwd_avx2(auVar36,_DAT_001803e0);
      auVar24 = vpaddd_avx2(auVar24,auVar25);
      auVar25 = vpmaddwd_avx2(auVar50,_DAT_00180400);
      auVar24 = vpaddd_avx2(auVar24,auVar25);
      auVar23 = vpaddd_avx2(auVar23,auVar24);
      auVar24 = vpmaddwd_avx2(auVar51,_DAT_00180420);
      auVar23 = vpaddd_avx2(auVar23,auVar24);
      auVar24 = vpmaddwd_avx2(auVar55,_DAT_00180440);
      auVar25._8_4_ = 0xffd3002b;
      auVar25._0_8_ = 0xffd3002bffd3002b;
      auVar25._12_4_ = 0xffd3002b;
      auVar25._16_4_ = 0xffd3002b;
      auVar25._20_4_ = 0xffd3002b;
      auVar25._24_4_ = 0xffd3002b;
      auVar25._28_4_ = 0xffd3002b;
      auVar25 = vpmaddwd_avx2(auVar57,auVar25);
      auVar24 = vpaddd_avx2(auVar25,auVar24);
      auVar25 = vpmaddwd_avx2(auVar47,_DAT_00180460);
      auVar26 = vpmaddwd_avx2(auVar48,_DAT_00180480);
      auVar25 = vpaddd_avx2(auVar25,auVar26);
      auVar24 = vpaddd_avx2(auVar24,auVar25);
      auVar25 = vpmaddwd_avx2(auVar41,_DAT_001804a0);
      auVar26 = vpmaddwd_avx2(auVar36,_DAT_001804c0);
      auVar25 = vpaddd_avx2(auVar25,auVar26);
      auVar26 = vpmaddwd_avx2(auVar50,_DAT_001804e0);
      auVar25 = vpaddd_avx2(auVar25,auVar26);
      auVar24 = vpaddd_avx2(auVar24,auVar25);
      auVar25 = vpmaddwd_avx2(auVar51,_DAT_00180500);
      auVar24 = vpaddd_avx2(auVar24,auVar25);
      auVar25 = vpmaddwd_avx2(auVar55,_DAT_00180520);
      auVar26 = vpmaddwd_avx2(auVar57,_DAT_00180540);
      auVar25 = vpaddd_avx2(auVar26,auVar25);
      auVar26 = vpmaddwd_avx2(auVar47,_DAT_00180560);
      auVar27 = vpmaddwd_avx2(auVar48,_DAT_00180580);
      auVar26 = vpaddd_avx2(auVar26,auVar27);
      auVar25 = vpaddd_avx2(auVar25,auVar26);
      auVar26 = vpmaddwd_avx2(auVar41,_DAT_001805a0);
      auVar27 = vpmaddwd_avx2(auVar36,_DAT_001805c0);
      auVar26 = vpaddd_avx2(auVar26,auVar27);
      auVar27 = vpmaddwd_avx2(auVar50,_DAT_001805e0);
      auVar26 = vpaddd_avx2(auVar26,auVar27);
      auVar25 = vpaddd_avx2(auVar25,auVar26);
      auVar26 = vpmaddwd_avx2(auVar51,_DAT_00180600);
      auVar25 = vpaddd_avx2(auVar25,auVar26);
      auVar26 = vpmaddwd_avx2(auVar55,_DAT_00180620);
      auVar27 = vpmaddwd_avx2(auVar57,_DAT_00180640);
      auVar26 = vpaddd_avx2(auVar27,auVar26);
      auVar27 = vpmaddwd_avx2(auVar47,_DAT_00180660);
      auVar47 = vpmaddwd_avx2(auVar48,_DAT_00180680);
      auVar27 = vpaddd_avx2(auVar27,auVar47);
      auVar26 = vpaddd_avx2(auVar26,auVar27);
      auVar27 = vpmaddwd_avx2(auVar41,_DAT_001806a0);
      auVar47 = vpmaddwd_avx2(auVar36,_DAT_001806c0);
      auVar27 = vpaddd_avx2(auVar27,auVar47);
      auVar47 = vpmaddwd_avx2(auVar50,_DAT_001806e0);
      auVar27 = vpaddd_avx2(auVar27,auVar47);
      auVar26 = vpaddd_avx2(auVar26,auVar27);
      auVar27 = vpmaddwd_avx2(auVar51,_DAT_00180700);
      auVar26 = vpaddd_avx2(auVar26,auVar27);
      auVar8 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 2) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 6) + uVar34));
      auVar49 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 2) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 6) + uVar34));
      auVar9 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 10) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xe) + uVar34));
      auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 10) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xe) + uVar34));
      auVar10 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x12) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x16) + uVar34));
      auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x12) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x16) + uVar34));
      auVar11 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x1a) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x1e) + uVar34));
      auVar3 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x1a) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x1e) + uVar34));
      auVar12 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 4) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0xc) + uVar34));
      auVar4 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 4) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0xc) + uVar34));
      auVar13 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x14) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x1c) + uVar34));
      auVar5 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 0x14) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x1c) + uVar34));
      auVar14 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 8) + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x18) + uVar34));
      auVar6 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + (long)(i_src * 8) + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x18) + uVar34));
      auVar15 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + uVar34),
                               *(undefined1 (*) [16])(src + (long)(i_src * 0x10) + uVar34));
      auVar7 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + uVar34),
                              *(undefined1 (*) [16])(src + (long)(i_src * 0x10) + uVar34));
      auVar45._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar8;
      auVar45._16_16_ = ZEXT116(1) * auVar49;
      auVar42._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar9;
      auVar42._16_16_ = ZEXT116(1) * auVar1;
      auVar27 = vpmaddwd_avx2(auVar28,auVar45);
      auVar47 = vpmaddwd_avx2(auVar42,_DAT_0017f240);
      auVar27 = vpaddd_avx2(auVar47,auVar27);
      auVar40._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar10;
      auVar40._16_16_ = ZEXT116(1) * auVar2;
      auVar37._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar11;
      auVar37._16_16_ = ZEXT116(1) * auVar3;
      auVar47 = vpmaddwd_avx2(auVar40,_DAT_0017f260);
      auVar28 = vpmaddwd_avx2(auVar37,_DAT_0017f280);
      auVar47 = vpaddd_avx2(auVar47,auVar28);
      auVar27 = vpaddd_avx2(auVar27,auVar47);
      auVar47 = vpmaddwd_avx2(auVar45,_DAT_0017f2a0);
      auVar28 = vpmaddwd_avx2(auVar42,_DAT_0017f2c0);
      auVar47 = vpaddd_avx2(auVar28,auVar47);
      auVar28 = vpmaddwd_avx2(auVar40,_DAT_0017f2e0);
      auVar36 = vpmaddwd_avx2(auVar37,_DAT_0017f300);
      auVar28 = vpaddd_avx2(auVar28,auVar36);
      auVar47 = vpaddd_avx2(auVar47,auVar28);
      auVar28 = vpmaddwd_avx2(auVar45,_DAT_0017f320);
      auVar36 = vpmaddwd_avx2(auVar42,_DAT_0017f340);
      auVar28 = vpaddd_avx2(auVar36,auVar28);
      auVar36 = vpmaddwd_avx2(auVar40,_DAT_0017f360);
      auVar41 = vpmaddwd_avx2(auVar37,_DAT_0017f380);
      auVar36 = vpaddd_avx2(auVar36,auVar41);
      auVar28 = vpaddd_avx2(auVar28,auVar36);
      auVar36 = vpmaddwd_avx2(auVar45,_DAT_0017f3a0);
      auVar41 = vpmaddwd_avx2(auVar42,_DAT_0017f3c0);
      auVar36 = vpaddd_avx2(auVar41,auVar36);
      auVar41 = vpmaddwd_avx2(auVar40,_DAT_0017f3e0);
      auVar48 = vpmaddwd_avx2(auVar37,_DAT_0017f400);
      auVar41 = vpaddd_avx2(auVar41,auVar48);
      auVar36 = vpaddd_avx2(auVar36,auVar41);
      auVar41 = vpmaddwd_avx2(auVar45,_DAT_0017f420);
      auVar48 = vpmaddwd_avx2(auVar42,_DAT_0017f440);
      auVar41 = vpaddd_avx2(auVar48,auVar41);
      auVar48 = vpmaddwd_avx2(auVar40,_DAT_0017f460);
      auVar50 = vpmaddwd_avx2(auVar37,_DAT_0017f480);
      auVar48 = vpaddd_avx2(auVar48,auVar50);
      auVar41 = vpaddd_avx2(auVar41,auVar48);
      auVar48 = vpmaddwd_avx2(auVar45,_DAT_0017f4a0);
      auVar50 = vpmaddwd_avx2(auVar42,_DAT_0017f4c0);
      auVar48 = vpaddd_avx2(auVar50,auVar48);
      auVar50 = vpmaddwd_avx2(auVar40,_DAT_0017f4e0);
      auVar51 = vpmaddwd_avx2(auVar37,_DAT_0017f500);
      auVar50 = vpaddd_avx2(auVar51,auVar50);
      auVar48 = vpaddd_avx2(auVar48,auVar50);
      auVar50 = vpmaddwd_avx2(auVar45,_DAT_0017f520);
      auVar51 = vpmaddwd_avx2(auVar42,_DAT_0017f540);
      auVar50 = vpaddd_avx2(auVar51,auVar50);
      auVar51 = vpmaddwd_avx2(auVar40,_DAT_0017f560);
      auVar55 = vpmaddwd_avx2(auVar37,_DAT_0017f580);
      auVar51 = vpaddd_avx2(auVar51,auVar55);
      auVar50 = vpaddd_avx2(auVar51,auVar50);
      auVar51 = vpmaddwd_avx2(auVar45,_DAT_0017f5a0);
      auVar55 = vpmaddwd_avx2(auVar42,_DAT_0017f5c0);
      auVar51 = vpaddd_avx2(auVar55,auVar51);
      auVar55 = vpmaddwd_avx2(auVar40,_DAT_0017f5e0);
      auVar29._8_4_ = 0xffd3002b;
      auVar29._0_8_ = 0xffd3002bffd3002b;
      auVar29._12_4_ = 0xffd3002b;
      auVar29._16_4_ = 0xffd3002b;
      auVar29._20_4_ = 0xffd3002b;
      auVar29._24_4_ = 0xffd3002b;
      auVar29._28_4_ = 0xffd3002b;
      auVar29 = vpmaddwd_avx2(auVar37,auVar29);
      auVar55 = vpaddd_avx2(auVar55,auVar29);
      auVar51 = vpaddd_avx2(auVar51,auVar55);
      auVar38._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar12;
      auVar38._16_16_ = ZEXT116(1) * auVar4;
      auVar43._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar13;
      auVar43._16_16_ = ZEXT116(1) * auVar5;
      auVar55 = vpmaddwd_avx2(auVar38,_DAT_0017f620);
      auVar29 = vpmaddwd_avx2(auVar43,_DAT_0017f640);
      auVar55 = vpaddd_avx2(auVar29,auVar55);
      auVar29 = vpmaddwd_avx2(auVar38,_DAT_0017f660);
      auVar37 = vpmaddwd_avx2(auVar43,_DAT_0017f680);
      auVar29 = vpaddd_avx2(auVar37,auVar29);
      auVar37 = vpmaddwd_avx2(auVar38,_DAT_0017f6a0);
      auVar40 = vpmaddwd_avx2(auVar43,_DAT_0017f6c0);
      auVar37 = vpaddd_avx2(auVar40,auVar37);
      auVar40 = vpmaddwd_avx2(auVar38,_DAT_0017f6e0);
      auVar30 = vpmaddwd_avx2(auVar43,_DAT_0017f700);
      auVar40 = vpaddd_avx2(auVar30,auVar40);
      auVar44._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar14;
      auVar44._16_16_ = ZEXT116(1) * auVar6;
      auVar53._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar15;
      auVar53._16_16_ = ZEXT116(1) * auVar7;
      auVar38 = vpmaddwd_avx2(auVar44,_DAT_0017f720);
      auVar30._8_2_ = 0x20;
      auVar30._0_8_ = 0x20002000200020;
      auVar30._10_2_ = 0x20;
      auVar30._12_2_ = 0x20;
      auVar30._14_2_ = 0x20;
      auVar30._16_2_ = 0x20;
      auVar30._18_2_ = 0x20;
      auVar30._20_2_ = 0x20;
      auVar30._22_2_ = 0x20;
      auVar30._24_2_ = 0x20;
      auVar30._26_2_ = 0x20;
      auVar30._28_2_ = 0x20;
      auVar30._30_2_ = 0x20;
      auVar42 = vpmaddwd_avx2(auVar53,auVar30);
      auVar30 = vpaddd_avx2(auVar42,auVar38);
      auVar45 = vpsubd_avx2(auVar42,auVar38);
      auVar42 = vpmaddwd_avx2(auVar44,_DAT_0017f740);
      auVar43 = vpmaddwd_avx2(auVar53,_DAT_0017f760);
      auVar38 = vpaddd_avx2(auVar43,auVar42);
      auVar43 = vpsubd_avx2(auVar43,auVar42);
      auVar42 = vpaddd_avx2(auVar30,auVar55);
      auVar30 = vpsubd_avx2(auVar30,auVar55);
      auVar55 = vpaddd_avx2(auVar38,auVar29);
      auVar38 = vpsubd_avx2(auVar38,auVar29);
      auVar29 = vpaddd_avx2(auVar43,auVar37);
      auVar43 = vpsubd_avx2(auVar43,auVar37);
      auVar37 = vpaddd_avx2(auVar45,auVar40);
      auVar40 = vpsubd_avx2(auVar45,auVar40);
      auVar45 = vpsubd_avx2(auVar42,auVar27);
      auVar31._4_4_ = iVar32;
      auVar31._0_4_ = iVar32;
      auVar31._8_4_ = iVar32;
      auVar31._12_4_ = iVar32;
      auVar31._16_4_ = iVar32;
      auVar31._20_4_ = iVar32;
      auVar31._24_4_ = iVar32;
      auVar31._28_4_ = iVar32;
      auVar27 = vpaddd_avx2(auVar27,auVar31);
      auVar27 = vpaddd_avx2(auVar27,auVar42);
      auVar42 = vpsubd_avx2(auVar55,auVar47);
      auVar47 = vpaddd_avx2(auVar47,auVar31);
      auVar47 = vpaddd_avx2(auVar47,auVar55);
      auVar44 = vpsubd_avx2(auVar29,auVar28);
      auVar28 = vpaddd_avx2(auVar28,auVar31);
      auVar28 = vpaddd_avx2(auVar29,auVar28);
      auVar29 = vpsubd_avx2(auVar37,auVar36);
      auVar36 = vpaddd_avx2(auVar36,auVar31);
      auVar36 = vpaddd_avx2(auVar37,auVar36);
      auVar37 = vpsubd_avx2(auVar40,auVar41);
      auVar41 = vpaddd_avx2(auVar41,auVar31);
      auVar41 = vpaddd_avx2(auVar41,auVar40);
      auVar40 = vpsubd_avx2(auVar43,auVar48);
      auVar48 = vpaddd_avx2(auVar48,auVar31);
      auVar48 = vpaddd_avx2(auVar43,auVar48);
      auVar43 = vpsubd_avx2(auVar38,auVar50);
      auVar50 = vpaddd_avx2(auVar50,auVar31);
      auVar50 = vpaddd_avx2(auVar38,auVar50);
      auVar38 = vpsubd_avx2(auVar30,auVar51);
      auVar51 = vpaddd_avx2(auVar51,auVar31);
      auVar51 = vpaddd_avx2(auVar51,auVar30);
      auVar55 = vpaddd_avx2(auVar27,auVar54);
      auVar30 = vpsubd_avx2(auVar27,auVar54);
      auVar27 = vpaddd_avx2(auVar47,auVar46);
      auVar53 = vpsubd_avx2(auVar47,auVar46);
      auVar46 = vpaddd_avx2(auVar28,auVar52);
      auVar28 = vpsubd_avx2(auVar28,auVar52);
      auVar47 = vpaddd_avx2(auVar36,auVar58);
      auVar36 = vpsubd_avx2(auVar36,auVar58);
      auVar54 = vpaddd_avx2(auVar41,auVar56);
      auVar41 = vpsubd_avx2(auVar41,auVar56);
      auVar52 = vpaddd_avx2(auVar48,auVar16);
      auVar48 = vpsubd_avx2(auVar48,auVar16);
      auVar58 = vpaddd_avx2(auVar50,auVar17);
      auVar50 = vpsubd_avx2(auVar50,auVar17);
      auVar56 = vpaddd_avx2(auVar51,auVar18);
      auVar51 = vpsubd_avx2(auVar51,auVar18);
      auVar16 = vpaddd_avx2(auVar38,auVar31);
      auVar17 = vpaddd_avx2(auVar16,auVar19);
      auVar38 = vpsubd_avx2(auVar16,auVar19);
      auVar16 = vpaddd_avx2(auVar43,auVar31);
      auVar18 = vpaddd_avx2(auVar16,auVar20);
      auVar43 = vpsubd_avx2(auVar16,auVar20);
      auVar16 = vpaddd_avx2(auVar40,auVar31);
      auVar19 = vpaddd_avx2(auVar16,auVar21);
      auVar40 = vpsubd_avx2(auVar16,auVar21);
      auVar16 = vpaddd_avx2(auVar31,auVar37);
      auVar20 = vpaddd_avx2(auVar16,auVar22);
      auVar37 = vpsubd_avx2(auVar16,auVar22);
      auVar16 = vpaddd_avx2(auVar31,auVar29);
      auVar21 = vpaddd_avx2(auVar16,auVar23);
      auVar29 = vpsubd_avx2(auVar16,auVar23);
      auVar16 = vpaddd_avx2(auVar31,auVar44);
      auVar22 = vpaddd_avx2(auVar16,auVar24);
      auVar44 = vpsubd_avx2(auVar16,auVar24);
      auVar16 = vpaddd_avx2(auVar31,auVar42);
      auVar23 = vpaddd_avx2(auVar16,auVar25);
      auVar42 = vpsubd_avx2(auVar16,auVar25);
      auVar16 = vpaddd_avx2(auVar31,auVar45);
      auVar25 = vpsrad_avx2(auVar55,ZEXT416((uint)shift));
      auVar24 = vpaddd_avx2(auVar16,auVar26);
      auVar26 = vpsubd_avx2(auVar16,auVar26);
      auVar54 = vpsrad_avx2(auVar54,ZEXT416((uint)shift));
      auVar54 = vpackssdw_avx2(auVar25,auVar54);
      auVar49 = ZEXT416((uint)shift);
      auVar16 = vpsrad_avx2(auVar27,auVar49);
      auVar25 = vpsrad_avx2(auVar46,auVar49);
      auVar46 = vpsrad_avx2(auVar52,auVar49);
      auVar52 = vpsrad_avx2(auVar58,auVar49);
      auVar46 = vpackssdw_avx2(auVar16,auVar46);
      auVar52 = vpackssdw_avx2(auVar25,auVar52);
      auVar49 = ZEXT416((uint)shift);
      auVar58 = vpsrad_avx2(auVar47,auVar49);
      auVar56 = vpsrad_avx2(auVar56,auVar49);
      auVar16 = vpsrad_avx2(auVar17,auVar49);
      auVar58 = vpackssdw_avx2(auVar58,auVar56);
      auVar56 = vpsrad_avx2(auVar21,auVar49);
      auVar56 = vpackssdw_avx2(auVar16,auVar56);
      auVar16 = vpsrad_avx2(auVar18,auVar49);
      auVar17 = vpsrad_avx2(auVar19,auVar49);
      auVar18 = vpsrad_avx2(auVar22,auVar49);
      auVar19 = vpsrad_avx2(auVar23,auVar49);
      auVar16 = vpackssdw_avx2(auVar16,auVar18);
      auVar17 = vpackssdw_avx2(auVar17,auVar19);
      auVar49 = ZEXT416((uint)shift);
      auVar18 = vpsrad_avx2(auVar20,auVar49);
      auVar19 = vpsrad_avx2(auVar24,auVar49);
      auVar20 = vpsrad_avx2(auVar26,auVar49);
      auVar18 = vpackssdw_avx2(auVar18,auVar19);
      auVar19 = vpsrad_avx2(auVar37,auVar49);
      auVar19 = vpackssdw_avx2(auVar20,auVar19);
      auVar20 = vpsrad_avx2(auVar42,auVar49);
      auVar21 = vpsrad_avx2(auVar44,auVar49);
      auVar22 = vpsrad_avx2(auVar40,auVar49);
      auVar23 = vpsrad_avx2(auVar43,auVar49);
      auVar20 = vpackssdw_avx2(auVar20,auVar22);
      auVar21 = vpackssdw_avx2(auVar21,auVar23);
      auVar22 = vpsrad_avx2(auVar29,auVar49);
      auVar23 = vpsrad_avx2(auVar38,auVar49);
      auVar24 = vpsrad_avx2(auVar51,auVar49);
      auVar22 = vpackssdw_avx2(auVar22,auVar23);
      auVar23 = vpsrad_avx2(auVar36,auVar49);
      auVar23 = vpackssdw_avx2(auVar24,auVar23);
      auVar24 = vpsrad_avx2(auVar50,auVar49);
      auVar25 = vpsrad_avx2(auVar48,auVar49);
      auVar26 = vpsrad_avx2(auVar28,auVar49);
      auVar27 = vpsrad_avx2(auVar53,auVar49);
      auVar24 = vpackssdw_avx2(auVar24,auVar26);
      auVar25 = vpackssdw_avx2(auVar25,auVar27);
      auVar26 = vpsrad_avx2(auVar41,ZEXT416((uint)shift));
      auVar27 = vpsrad_avx2(auVar30,ZEXT416((uint)shift));
      auVar26 = vpackssdw_avx2(auVar26,auVar27);
      auVar27 = vpunpcklwd_avx2(auVar54,auVar52);
      auVar54 = vpunpckhwd_avx2(auVar54,auVar52);
      auVar52 = vpunpcklwd_avx2(auVar46,auVar58);
      auVar46 = vpunpckhwd_avx2(auVar46,auVar58);
      auVar58 = vpunpcklwd_avx2(auVar27,auVar52);
      auVar52 = vpunpckhwd_avx2(auVar27,auVar52);
      auVar27 = vpunpcklwd_avx2(auVar54,auVar46);
      auVar54 = vpunpckhwd_avx2(auVar54,auVar46);
      auVar47 = vpunpcklqdq_avx2(auVar58,auVar27);
      auVar58 = vpunpckhqdq_avx2(auVar58,auVar27);
      auVar28 = vpunpcklqdq_avx2(auVar52,auVar54);
      auVar27 = vpunpckhqdq_avx2(auVar52,auVar54);
      auVar52 = vpunpcklwd_avx2(auVar56,auVar17);
      auVar54 = vpunpckhwd_avx2(auVar56,auVar17);
      auVar56 = vpunpcklwd_avx2(auVar16,auVar18);
      auVar46 = vpunpckhwd_avx2(auVar16,auVar18);
      auVar16 = vpunpcklwd_avx2(auVar52,auVar56);
      auVar52 = vpunpckhwd_avx2(auVar52,auVar56);
      auVar56 = vpunpcklwd_avx2(auVar54,auVar46);
      auVar54 = vpunpckhwd_avx2(auVar54,auVar46);
      auVar46 = vpunpcklqdq_avx2(auVar16,auVar56);
      auVar56 = vpunpckhqdq_avx2(auVar16,auVar56);
      auVar16 = vpunpcklqdq_avx2(auVar52,auVar54);
      auVar54 = vpunpckhqdq_avx2(auVar52,auVar54);
      local_4c8._0_16_ = ZEXT116(0) * auVar46._0_16_ + ZEXT116(1) * auVar47._0_16_;
      local_4c8._16_16_ = ZEXT116(0) * auVar47._16_16_ + ZEXT116(1) * auVar46._0_16_;
      local_508 = vperm2i128_avx2(auVar47,auVar46,0x31);
      auVar46._0_16_ = ZEXT116(0) * auVar56._0_16_ + ZEXT116(1) * auVar58._0_16_;
      auVar46._16_16_ = ZEXT116(0) * auVar58._16_16_ + ZEXT116(1) * auVar56._0_16_;
      local_548 = vperm2i128_avx2(auVar58,auVar56,0x31);
      local_528._0_16_ = ZEXT116(0) * auVar16._0_16_ + ZEXT116(1) * auVar28._0_16_;
      local_528._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar16._0_16_;
      auVar18 = vperm2i128_avx2(auVar28,auVar16,0x31);
      local_4e8._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar27._0_16_;
      local_4e8._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar54._0_16_;
      auVar27 = vperm2i128_avx2(auVar27,auVar54,0x31);
      auVar58 = vpunpcklwd_avx2(auVar19,auVar21);
      auVar54 = vpunpckhwd_avx2(auVar19,auVar21);
      auVar56 = vpunpcklwd_avx2(auVar20,auVar22);
      auVar52 = vpunpckhwd_avx2(auVar20,auVar22);
      auVar16 = vpunpcklwd_avx2(auVar58,auVar56);
      auVar58 = vpunpckhwd_avx2(auVar58,auVar56);
      auVar56 = vpunpcklwd_avx2(auVar54,auVar52);
      auVar54 = vpunpckhwd_avx2(auVar54,auVar52);
      auVar19 = vpunpcklqdq_avx2(auVar16,auVar56);
      auVar56 = vpunpckhqdq_avx2(auVar16,auVar56);
      auVar22 = vpunpcklqdq_avx2(auVar58,auVar54);
      auVar20 = vpunpckhqdq_avx2(auVar58,auVar54);
      auVar58 = vpunpcklwd_avx2(auVar23,auVar25);
      auVar54 = vpunpckhwd_avx2(auVar23,auVar25);
      auVar16 = vpunpcklwd_avx2(auVar24,auVar26);
      auVar52 = vpunpckhwd_avx2(auVar24,auVar26);
      auVar17 = vpunpcklwd_avx2(auVar58,auVar16);
      auVar58 = vpunpckhwd_avx2(auVar58,auVar16);
      auVar16 = vpunpcklwd_avx2(auVar54,auVar52);
      auVar54 = vpunpckhwd_avx2(auVar54,auVar52);
      auVar52 = vpunpcklqdq_avx2(auVar17,auVar16);
      auVar17 = vpunpckhqdq_avx2(auVar17,auVar16);
      auVar23 = vpunpcklqdq_avx2(auVar58,auVar54);
      auVar21 = vpunpckhqdq_avx2(auVar58,auVar54);
      auVar54._0_16_ = ZEXT116(0) * auVar52._0_16_ + ZEXT116(1) * auVar19._0_16_;
      auVar54._16_16_ = ZEXT116(0) * auVar19._16_16_ + ZEXT116(1) * auVar52._0_16_;
      auVar16 = vperm2i128_avx2(auVar19,auVar52,0x31);
      auVar52._0_16_ = ZEXT116(0) * auVar17._0_16_ + ZEXT116(1) * auVar56._0_16_;
      auVar52._16_16_ = ZEXT116(0) * auVar56._16_16_ + ZEXT116(1) * auVar17._0_16_;
      auVar17 = vperm2i128_avx2(auVar56,auVar17,0x31);
      auVar58._0_16_ = ZEXT116(0) * auVar23._0_16_ + ZEXT116(1) * auVar22._0_16_;
      auVar58._16_16_ = ZEXT116(0) * auVar22._16_16_ + ZEXT116(1) * auVar23._0_16_;
      auVar19 = vperm2i128_avx2(auVar22,auVar23,0x31);
      auVar56._0_16_ = ZEXT116(0) * auVar21._0_16_ + ZEXT116(1) * auVar20._0_16_;
      auVar56._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar21._0_16_;
      auVar20 = vperm2i128_avx2(auVar20,auVar21,0x31);
      if (bit_depth != 0xf) {
        auVar24._2_2_ = uVar35;
        auVar24._0_2_ = uVar35;
        auVar24._4_2_ = uVar35;
        auVar24._6_2_ = uVar35;
        auVar24._8_2_ = uVar35;
        auVar24._10_2_ = uVar35;
        auVar24._12_2_ = uVar35;
        auVar24._14_2_ = uVar35;
        auVar24._16_2_ = uVar35;
        auVar24._18_2_ = uVar35;
        auVar24._20_2_ = uVar35;
        auVar24._22_2_ = uVar35;
        auVar24._24_2_ = uVar35;
        auVar24._26_2_ = uVar35;
        auVar24._28_2_ = uVar35;
        auVar24._30_2_ = uVar35;
        auVar21 = vpminsw_avx2(auVar24,local_4c8);
        auVar54 = vpminsw_avx2(auVar54,auVar24);
        auVar46 = vpminsw_avx2(auVar46,auVar24);
        auVar52 = vpminsw_avx2(auVar52,auVar24);
        auVar23._2_2_ = sVar39;
        auVar23._0_2_ = sVar39;
        auVar23._4_2_ = sVar39;
        auVar23._6_2_ = sVar39;
        auVar23._8_2_ = sVar39;
        auVar23._10_2_ = sVar39;
        auVar23._12_2_ = sVar39;
        auVar23._14_2_ = sVar39;
        auVar23._16_2_ = sVar39;
        auVar23._18_2_ = sVar39;
        auVar23._20_2_ = sVar39;
        auVar23._22_2_ = sVar39;
        auVar23._24_2_ = sVar39;
        auVar23._26_2_ = sVar39;
        auVar23._28_2_ = sVar39;
        auVar23._30_2_ = sVar39;
        local_4c8 = vpmaxsw_avx2(auVar21,auVar23);
        auVar54 = vpmaxsw_avx2(auVar54,auVar23);
        auVar46 = vpmaxsw_avx2(auVar46,auVar23);
        auVar52 = vpmaxsw_avx2(auVar52,auVar23);
        auVar21 = vpminsw_avx2(auVar24,local_528);
        auVar58 = vpminsw_avx2(auVar58,auVar24);
        auVar22 = vpminsw_avx2(auVar24,local_4e8);
        auVar56 = vpminsw_avx2(auVar56,auVar24);
        local_528 = vpmaxsw_avx2(auVar21,auVar23);
        auVar58 = vpmaxsw_avx2(auVar58,auVar23);
        local_4e8 = vpmaxsw_avx2(auVar22,auVar23);
        auVar56 = vpmaxsw_avx2(auVar56,auVar23);
        auVar21 = vpminsw_avx2(auVar24,local_508);
        auVar16 = vpminsw_avx2(auVar16,auVar24);
        auVar22 = vpminsw_avx2(auVar24,local_548);
        auVar17 = vpminsw_avx2(auVar17,auVar24);
        local_508 = vpmaxsw_avx2(auVar21,auVar23);
        auVar16 = vpmaxsw_avx2(auVar16,auVar23);
        local_548 = vpmaxsw_avx2(auVar22,auVar23);
        auVar17 = vpmaxsw_avx2(auVar17,auVar23);
        auVar18 = vpminsw_avx2(auVar18,auVar24);
        auVar19 = vpminsw_avx2(auVar19,auVar24);
        auVar21 = vpminsw_avx2(auVar24,auVar27);
        auVar20 = vpminsw_avx2(auVar20,auVar24);
        auVar18 = vpmaxsw_avx2(auVar18,auVar23);
        auVar19 = vpmaxsw_avx2(auVar19,auVar23);
        auVar27 = vpmaxsw_avx2(auVar21,auVar23);
        auVar20 = vpmaxsw_avx2(auVar20,auVar23);
      }
      *(undefined8 *)dst = local_4c8._0_8_;
      *(undefined8 *)(dst + 4) = local_4c8._8_8_;
      *(undefined8 *)(dst + 8) = local_4c8._16_8_;
      *(undefined8 *)(dst + 0xc) = local_4c8._24_8_;
      *(undefined1 (*) [32])(dst + 0x10) = auVar54;
      *(undefined1 (*) [32])(dst + 0x20) = auVar46;
      *(undefined1 (*) [32])(dst + 0x30) = auVar52;
      *(undefined8 *)(dst + 0x40) = local_528._0_8_;
      *(undefined8 *)(dst + 0x44) = local_528._8_8_;
      *(undefined8 *)(dst + 0x48) = local_528._16_8_;
      *(undefined8 *)(dst + 0x4c) = local_528._24_8_;
      *(undefined1 (*) [32])(dst + 0x50) = auVar58;
      *(undefined8 *)(dst + 0x60) = local_4e8._0_8_;
      *(undefined8 *)(dst + 100) = local_4e8._8_8_;
      *(undefined8 *)(dst + 0x68) = local_4e8._16_8_;
      *(undefined8 *)(dst + 0x6c) = local_4e8._24_8_;
      *(undefined1 (*) [32])(dst + 0x70) = auVar56;
      *(undefined8 *)(dst + 0x80) = local_508._0_8_;
      *(undefined8 *)(dst + 0x84) = local_508._8_8_;
      *(undefined8 *)(dst + 0x88) = local_508._16_8_;
      *(undefined8 *)(dst + 0x8c) = local_508._24_8_;
      *(undefined1 (*) [32])(dst + 0x90) = auVar16;
      *(undefined8 *)(dst + 0xa0) = local_548._0_8_;
      *(undefined8 *)(dst + 0xa4) = local_548._8_8_;
      *(undefined8 *)(dst + 0xa8) = local_548._16_8_;
      *(undefined8 *)(dst + 0xac) = local_548._24_8_;
      *(undefined1 (*) [32])(dst + 0xb0) = auVar17;
      *(undefined1 (*) [32])(dst + 0xc0) = auVar18;
      *(undefined1 (*) [32])(dst + 0xd0) = auVar19;
      *(undefined1 (*) [32])(dst + 0xe0) = auVar27;
      *(undefined1 (*) [32])(dst + 0xf0) = auVar20;
      dst = dst + 0x100;
      uVar34 = uVar34 + 8;
    } while (uVar34 < (uint)line);
  }
  return;
}

Assistant:

void dct2_butterfly_h32_avx2(s16* src, int i_src, s16* dst, int line, int shift, int bit_depth)
{
    const __m256i c16_p45_p45 = _mm256_set1_epi32(0x002D002D);
    const __m256i c16_p43_p44 = _mm256_set1_epi32(0x002B002C);
    const __m256i c16_p39_p41 = _mm256_set1_epi32(0x00270029);
    const __m256i c16_p34_p36 = _mm256_set1_epi32(0x00220024);
    const __m256i c16_p27_p30 = _mm256_set1_epi32(0x001B001E);
    const __m256i c16_p19_p23 = _mm256_set1_epi32(0x00130017);
    const __m256i c16_p11_p15 = _mm256_set1_epi32(0x000B000F);
    const __m256i c16_p02_p07 = _mm256_set1_epi32(0x00020007);
    const __m256i c16_p41_p45 = _mm256_set1_epi32(0x0029002D);
    const __m256i c16_p23_p34 = _mm256_set1_epi32(0x00170022);
    const __m256i c16_n02_p11 = _mm256_set1_epi32(0xFFFE000B);
    const __m256i c16_n27_n15 = _mm256_set1_epi32(0xFFE5FFF1);
    const __m256i c16_n43_n36 = _mm256_set1_epi32(0xFFD5FFDC);
    const __m256i c16_n44_n45 = _mm256_set1_epi32(0xFFD4FFD3);
    const __m256i c16_n30_n39 = _mm256_set1_epi32(0xFFE2FFD9);
    const __m256i c16_n07_n19 = _mm256_set1_epi32(0xFFF9FFED);
    const __m256i c16_p34_p44 = _mm256_set1_epi32(0x0022002C);
    const __m256i c16_n07_p15 = _mm256_set1_epi32(0xFFF9000F);
    const __m256i c16_n41_n27 = _mm256_set1_epi32(0xFFD7FFE5);
    const __m256i c16_n39_n45 = _mm256_set1_epi32(0xFFD9FFD3);
    const __m256i c16_n02_n23 = _mm256_set1_epi32(0xFFFEFFE9);
    const __m256i c16_p36_p19 = _mm256_set1_epi32(0x00240013);
    const __m256i c16_p43_p45 = _mm256_set1_epi32(0x002B002D);
    const __m256i c16_p11_p30 = _mm256_set1_epi32(0x000B001E);
    const __m256i c16_p23_p43 = _mm256_set1_epi32(0x0017002B);
    const __m256i c16_n34_n07 = _mm256_set1_epi32(0xFFDEFFF9);
    const __m256i c16_n36_n45 = _mm256_set1_epi32(0xFFDCFFD3);
    const __m256i c16_p19_n11 = _mm256_set1_epi32(0x0013FFF5);
    const __m256i c16_p44_p41 = _mm256_set1_epi32(0x002C0029);
    const __m256i c16_n02_p27 = _mm256_set1_epi32(0xFFFE001B);
    const __m256i c16_n45_n30 = _mm256_set1_epi32(0xFFD3FFE2);
    const __m256i c16_n15_n39 = _mm256_set1_epi32(0xFFF1FFD9);
    const __m256i c16_p11_p41 = _mm256_set1_epi32(0x000B0029);
    const __m256i c16_n45_n27 = _mm256_set1_epi32(0xFFD3FFE5);
    const __m256i c16_p07_n30 = _mm256_set1_epi32(0x0007FFE2);
    const __m256i c16_p43_p39 = _mm256_set1_epi32(0x002B0027);
    const __m256i c16_n23_p15 = _mm256_set1_epi32(0xFFE9000F);
    const __m256i c16_n34_n45 = _mm256_set1_epi32(0xFFDEFFD3);
    const __m256i c16_p36_p02 = _mm256_set1_epi32(0x00240002);
    const __m256i c16_p19_p44 = _mm256_set1_epi32(0x0013002C);
    const __m256i c16_n02_p39 = _mm256_set1_epi32(0xFFFE0027);
    const __m256i c16_n36_n41 = _mm256_set1_epi32(0xFFDCFFD7);
    const __m256i c16_p43_p07 = _mm256_set1_epi32(0x002B0007);
    const __m256i c16_n11_p34 = _mm256_set1_epi32(0xFFF50022);
    const __m256i c16_n30_n44 = _mm256_set1_epi32(0xFFE2FFD4);
    const __m256i c16_p45_p15 = _mm256_set1_epi32(0x002D000F);
    const __m256i c16_n19_p27 = _mm256_set1_epi32(0xFFED001B);
    const __m256i c16_n23_n45 = _mm256_set1_epi32(0xFFE9FFD3);
    const __m256i c16_n15_p36 = _mm256_set1_epi32(0xFFF10024);
    const __m256i c16_n11_n45 = _mm256_set1_epi32(0xFFF5FFD3);
    const __m256i c16_p34_p39 = _mm256_set1_epi32(0x00220027);
    const __m256i c16_n45_n19 = _mm256_set1_epi32(0xFFD3FFED);
    const __m256i c16_p41_n07 = _mm256_set1_epi32(0x0029FFF9);
    const __m256i c16_n23_p30 = _mm256_set1_epi32(0xFFE9001E);
    const __m256i c16_n02_n44 = _mm256_set1_epi32(0xFFFEFFD4);
    const __m256i c16_p27_p43 = _mm256_set1_epi32(0x001B002B);
    const __m256i c16_n27_p34 = _mm256_set1_epi32(0xFFE50022);
    const __m256i c16_p19_n39 = _mm256_set1_epi32(0x0013FFD9);
    const __m256i c16_n11_p43 = _mm256_set1_epi32(0xFFF5002B);
    const __m256i c16_p02_n45 = _mm256_set1_epi32(0x0002FFD3);
    const __m256i c16_p07_p45 = _mm256_set1_epi32(0x0007002D);
    const __m256i c16_n15_n44 = _mm256_set1_epi32(0xFFF1FFD4);
    const __m256i c16_p23_p41 = _mm256_set1_epi32(0x00170029);
    const __m256i c16_n30_n36 = _mm256_set1_epi32(0xFFE2FFDC);
    const __m256i c16_n36_p30 = _mm256_set1_epi32(0xFFDC001E);
    const __m256i c16_p41_n23 = _mm256_set1_epi32(0x0029FFE9);
    const __m256i c16_n44_p15 = _mm256_set1_epi32(0xFFD4000F);
    const __m256i c16_p45_n07 = _mm256_set1_epi32(0x002DFFF9);
    const __m256i c16_n45_n02 = _mm256_set1_epi32(0xFFD3FFFE);
    const __m256i c16_p43_p11 = _mm256_set1_epi32(0x002B000B);
    const __m256i c16_n39_n19 = _mm256_set1_epi32(0xFFD9FFED);
    const __m256i c16_p34_p27 = _mm256_set1_epi32(0x0022001B);
    const __m256i c16_n43_p27 = _mm256_set1_epi32(0xFFD5001B);
    const __m256i c16_p44_n02 = _mm256_set1_epi32(0x002CFFFE);
    const __m256i c16_n30_n23 = _mm256_set1_epi32(0xFFE2FFE9);
    const __m256i c16_p07_p41 = _mm256_set1_epi32(0x00070029);
    const __m256i c16_p19_n45 = _mm256_set1_epi32(0x0013FFD3);
    const __m256i c16_n39_p34 = _mm256_set1_epi32(0xFFD90022);
    const __m256i c16_p45_n11 = _mm256_set1_epi32(0x002DFFF5);
    const __m256i c16_n36_n15 = _mm256_set1_epi32(0xFFDCFFF1);
    const __m256i c16_n45_p23 = _mm256_set1_epi32(0xFFD30017);
    const __m256i c16_p27_p19 = _mm256_set1_epi32(0x001B0013);
    const __m256i c16_p15_n45 = _mm256_set1_epi32(0x000FFFD3);
    const __m256i c16_n44_p30 = _mm256_set1_epi32(0xFFD4001E);
    const __m256i c16_p34_p11 = _mm256_set1_epi32(0x0022000B);
    const __m256i c16_p07_n43 = _mm256_set1_epi32(0x0007FFD5);
    const __m256i c16_n41_p36 = _mm256_set1_epi32(0xFFD70024);
    const __m256i c16_p39_p02 = _mm256_set1_epi32(0x00270002);
    const __m256i c16_n44_p19 = _mm256_set1_epi32(0xFFD40013);
    const __m256i c16_n02_p36 = _mm256_set1_epi32(0xFFFE0024);
    const __m256i c16_p45_n34 = _mm256_set1_epi32(0x002DFFDE);
    const __m256i c16_n15_n23 = _mm256_set1_epi32(0xFFF1FFE9);
    const __m256i c16_n39_p43 = _mm256_set1_epi32(0xFFD9002B);
    const __m256i c16_p30_p07 = _mm256_set1_epi32(0x001E0007);
    const __m256i c16_p27_n45 = _mm256_set1_epi32(0x001BFFD3);
    const __m256i c16_n41_p11 = _mm256_set1_epi32(0xFFD7000B);
    const __m256i c16_n39_p15 = _mm256_set1_epi32(0xFFD9000F);
    const __m256i c16_n30_p45 = _mm256_set1_epi32(0xFFE2002D);
    const __m256i c16_p27_p02 = _mm256_set1_epi32(0x001B0002);
    const __m256i c16_p41_n44 = _mm256_set1_epi32(0x0029FFD4);
    const __m256i c16_n11_n19 = _mm256_set1_epi32(0xFFF5FFED);
    const __m256i c16_n45_p36 = _mm256_set1_epi32(0xFFD30024);
    const __m256i c16_n07_p34 = _mm256_set1_epi32(0xFFF90022);
    const __m256i c16_p43_n23 = _mm256_set1_epi32(0x002BFFE9);
    const __m256i c16_n30_p11 = _mm256_set1_epi32(0xFFE2000B);
    const __m256i c16_n45_p43 = _mm256_set1_epi32(0xFFD3002B);
    const __m256i c16_n19_p36 = _mm256_set1_epi32(0xFFED0024);
    const __m256i c16_p23_n02 = _mm256_set1_epi32(0x0017FFFE);
    const __m256i c16_p45_n39 = _mm256_set1_epi32(0x002DFFD9);
    const __m256i c16_p27_n41 = _mm256_set1_epi32(0x001BFFD7);
    const __m256i c16_n15_n07 = _mm256_set1_epi32(0xFFF1FFF9);
    const __m256i c16_n44_p34 = _mm256_set1_epi32(0xFFD40022);
    const __m256i c16_n19_p07 = _mm256_set1_epi32(0xFFED0007);
    const __m256i c16_n39_p30 = _mm256_set1_epi32(0xFFD9001E);
    const __m256i c16_n45_p44 = _mm256_set1_epi32(0xFFD3002C);
    const __m256i c16_n36_p43 = _mm256_set1_epi32(0xFFDC002B);
    const __m256i c16_n15_p27 = _mm256_set1_epi32(0xFFF1001B);
    const __m256i c16_p11_p02 = _mm256_set1_epi32(0x000B0002);
    const __m256i c16_p34_n23 = _mm256_set1_epi32(0x0022FFE9);
    const __m256i c16_p45_n41 = _mm256_set1_epi32(0x002DFFD7);
    const __m256i c16_n07_p02 = _mm256_set1_epi32(0xFFF90002);
    const __m256i c16_n15_p11 = _mm256_set1_epi32(0xFFF1000B);
    const __m256i c16_n23_p19 = _mm256_set1_epi32(0xFFE90013);
    const __m256i c16_n30_p27 = _mm256_set1_epi32(0xFFE2001B);
    const __m256i c16_n36_p34 = _mm256_set1_epi32(0xFFDC0022);
    const __m256i c16_n41_p39 = _mm256_set1_epi32(0xFFD70027);
    const __m256i c16_n44_p43 = _mm256_set1_epi32(0xFFD4002B);
    const __m256i c16_n45_p45 = _mm256_set1_epi32(0xFFD3002D);

    const __m256i c16_p35_p40 = _mm256_set1_epi32(0x00230028);
    const __m256i c16_p21_p29 = _mm256_set1_epi32(0x0015001D);
    const __m256i c16_p04_p13 = _mm256_set1_epi32(0x0004000D);
    const __m256i c16_p29_p43 = _mm256_set1_epi32(0x001D002B);
    const __m256i c16_n21_p04 = _mm256_set1_epi32(0xFFEB0004);
    const __m256i c16_n45_n40 = _mm256_set1_epi32(0xFFD3FFD8);
    const __m256i c16_n13_n35 = _mm256_set1_epi32(0xFFF3FFDD);
    const __m256i c16_p04_p40 = _mm256_set1_epi32(0x00040028);
    const __m256i c16_n43_n35 = _mm256_set1_epi32(0xFFD5FFDD);
    const __m256i c16_p29_n13 = _mm256_set1_epi32(0x001DFFF3);
    const __m256i c16_p21_p45 = _mm256_set1_epi32(0x0015002D);
    const __m256i c16_n21_p35 = _mm256_set1_epi32(0xFFEB0023);
    const __m256i c16_p04_n43 = _mm256_set1_epi32(0x0004FFD5);
    const __m256i c16_p13_p45 = _mm256_set1_epi32(0x000D002D);
    const __m256i c16_n29_n40 = _mm256_set1_epi32(0xFFE3FFD8);
    const __m256i c16_n40_p29 = _mm256_set1_epi32(0xFFD8001D);
    const __m256i c16_p45_n13 = _mm256_set1_epi32(0x002DFFF3);
    const __m256i c16_n43_n04 = _mm256_set1_epi32(0xFFD5FFFC);
    const __m256i c16_p35_p21 = _mm256_set1_epi32(0x00230015);
    const __m256i c16_n45_p21 = _mm256_set1_epi32(0xFFD30015);
    const __m256i c16_p13_p29 = _mm256_set1_epi32(0x000D001D);
    const __m256i c16_p35_n43 = _mm256_set1_epi32(0x0023FFD5);
    const __m256i c16_n40_p04 = _mm256_set1_epi32(0xFFD80004);
    const __m256i c16_n35_p13 = _mm256_set1_epi32(0xFFDD000D);
    const __m256i c16_n40_p45 = _mm256_set1_epi32(0xFFD8002D);
    const __m256i c16_p04_p21 = _mm256_set1_epi32(0x00040015);
    const __m256i c16_p43_n29 = _mm256_set1_epi32(0x002BFFE3);
    const __m256i c16_n13_p04 = _mm256_set1_epi32(0xFFF30004);
    const __m256i c16_n29_p21 = _mm256_set1_epi32(0xFFE30015);
    const __m256i c16_n40_p35 = _mm256_set1_epi32(0xFFD80023);

    const __m256i c16_p38_p44 = _mm256_set1_epi32(0x0026002C);
    const __m256i c16_p09_p25 = _mm256_set1_epi32(0x00090019);
    const __m256i c16_n09_p38 = _mm256_set1_epi32(0xFFF70026);
    const __m256i c16_n25_n44 = _mm256_set1_epi32(0xFFE7FFD4);

    const __m256i c16_n44_p25 = _mm256_set1_epi32(0xFFD40019);
    const __m256i c16_p38_p09 = _mm256_set1_epi32(0x00260009);
    const __m256i c16_n25_p09 = _mm256_set1_epi32(0xFFE70009);
    const __m256i c16_n44_p38 = _mm256_set1_epi32(0xFFD40026);

    const __m256i c16_p17_p42 = _mm256_set1_epi32(0x0011002A);
    const __m256i c16_n42_p17 = _mm256_set1_epi32(0xFFD60011);

    const __m256i c16_p32_p32 = _mm256_set1_epi32(0x00200020);
    const __m256i c16_n32_p32 = _mm256_set1_epi32(0xFFE00020);

    __m256i c32_off = _mm256_set1_epi32(1 << (shift - 1));

    __m128i src00, src01, src02, src03, src04, src05, src06, src07, src08, src09, src10, src11, src12, src13, src14, src15;
    __m128i src16, src17, src18, src19, src20, src21, src22, src23, src24, src25, src26, src27, src28, src29, src30, src31;
    __m128i ss00, ss01, ss02, ss03, ss04, ss05, ss06, ss07, ss08, ss09, ss10, ss11, ss12, ss13, ss14, ss15;
    __m256i res00, res01, res02, res03, res04, res05, res06, res07, res08, res09, res10, res11, res12, res13, res14, res15;
    __m256i t0, t1, t2, t3, t4, t5, t6, t7;
    __m256i O00, O01, O02, O03, O04, O05, O06, O07, O08, O09, O10, O11, O12, O13, O14, O15;
    __m256i EO0, EO1, EO2, EO3, EO4, EO5, EO6, EO7;
    int i;

    for (i = 0; i < line; i += 8)
    {
        src01 = _mm_load_si128((const __m128i*)&src[1 * i_src + i]);
        src03 = _mm_load_si128((const __m128i*)&src[3 * i_src + i]);
        src05 = _mm_load_si128((const __m128i*)&src[5 * i_src + i]);
        src07 = _mm_load_si128((const __m128i*)&src[7 * i_src + i]);
        src09 = _mm_load_si128((const __m128i*)&src[9 * i_src + i]);
        src11 = _mm_load_si128((const __m128i*)&src[11 * i_src + i]);
        src13 = _mm_load_si128((const __m128i*)&src[13 * i_src + i]);
        src15 = _mm_load_si128((const __m128i*)&src[15 * i_src + i]);
        src17 = _mm_load_si128((const __m128i*)&src[17 * i_src + i]);
        src19 = _mm_load_si128((const __m128i*)&src[19 * i_src + i]);
        src21 = _mm_load_si128((const __m128i*)&src[21 * i_src + i]);
        src23 = _mm_load_si128((const __m128i*)&src[23 * i_src + i]);
        src25 = _mm_load_si128((const __m128i*)&src[25 * i_src + i]);
        src27 = _mm_load_si128((const __m128i*)&src[27 * i_src + i]);
        src29 = _mm_load_si128((const __m128i*)&src[29 * i_src + i]);
        src31 = _mm_load_si128((const __m128i*)&src[31 * i_src + i]);

        ss00 = _mm_unpacklo_epi16(src01, src03);
        ss01 = _mm_unpacklo_epi16(src05, src07);
        ss02 = _mm_unpacklo_epi16(src09, src11);
        ss03 = _mm_unpacklo_epi16(src13, src15);
        ss04 = _mm_unpacklo_epi16(src17, src19);
        ss05 = _mm_unpacklo_epi16(src21, src23);
        ss06 = _mm_unpacklo_epi16(src25, src27);
        ss07 = _mm_unpacklo_epi16(src29, src31);

        ss08 = _mm_unpackhi_epi16(src01, src03);
        ss09 = _mm_unpackhi_epi16(src05, src07);
        ss10 = _mm_unpackhi_epi16(src09, src11);
        ss11 = _mm_unpackhi_epi16(src13, src15);
        ss12 = _mm_unpackhi_epi16(src17, src19);
        ss13 = _mm_unpackhi_epi16(src21, src23);
        ss14 = _mm_unpackhi_epi16(src25, src27);
        ss15 = _mm_unpackhi_epi16(src29, src31);

        {
            const __m256i T_00_00 = _mm256_set_m128i(ss08, ss00);       // [33 13 32 12 31 11 30 10]
            const __m256i T_00_01 = _mm256_set_m128i(ss09, ss01);       // [ ]
            const __m256i T_00_02 = _mm256_set_m128i(ss10, ss02);       // [ ]
            const __m256i T_00_03 = _mm256_set_m128i(ss11, ss03);       // [ ]
            const __m256i T_00_04 = _mm256_set_m128i(ss12, ss04);       // [ ]
            const __m256i T_00_05 = _mm256_set_m128i(ss13, ss05);       // [ ]
            const __m256i T_00_06 = _mm256_set_m128i(ss14, ss06);       // [ ]
            const __m256i T_00_07 = _mm256_set_m128i(ss15, ss07);       //

#define COMPUTE_ROW(r0103, r0507, r0911, r1315, r1719, r2123, r2527, r2931, c0103, c0507, c0911, c1315, c1719, c2123, c2527, c2931, row) \
            t0 = _mm256_madd_epi16(r0103, c0103); \
            t1 = _mm256_madd_epi16(r0507, c0507); \
            t2 = _mm256_madd_epi16(r0911, c0911); \
            t3 = _mm256_madd_epi16(r1315, c1315); \
            t4 = _mm256_madd_epi16(r1719, c1719); \
            t5 = _mm256_madd_epi16(r2123, c2123); \
            t6 = _mm256_madd_epi16(r2527, c2527); \
            t7 = _mm256_madd_epi16(r2931, c2931); \
	        t0 = _mm256_add_epi32(t0, t1); \
	        t2 = _mm256_add_epi32(t2, t3); \
	        t4 = _mm256_add_epi32(t4, t5); \
	        t6 = _mm256_add_epi32(t6, t7); \
	        row = _mm256_add_epi32(_mm256_add_epi32(t0, t2), _mm256_add_epi32(t4, t6));

            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p45_p45, c16_p43_p44, c16_p39_p41, c16_p34_p36, c16_p27_p30, c16_p19_p23, c16_p11_p15, c16_p02_p07, O00)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p41_p45, c16_p23_p34, c16_n02_p11, c16_n27_n15, c16_n43_n36, c16_n44_n45, c16_n30_n39, c16_n07_n19, O01)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p34_p44, c16_n07_p15, c16_n41_n27, c16_n39_n45, c16_n02_n23, c16_p36_p19, c16_p43_p45, c16_p11_p30, O02)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p23_p43, c16_n34_n07, c16_n36_n45, c16_p19_n11, c16_p44_p41, c16_n02_p27, c16_n45_n30, c16_n15_n39, O03)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_p11_p41, c16_n45_n27, c16_p07_n30, c16_p43_p39, c16_n23_p15, c16_n34_n45, c16_p36_p02, c16_p19_p44, O04)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n02_p39, c16_n36_n41, c16_p43_p07, c16_n11_p34, c16_n30_n44, c16_p45_p15, c16_n19_p27, c16_n23_n45, O05)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n15_p36, c16_n11_n45, c16_p34_p39, c16_n45_n19, c16_p41_n07, c16_n23_p30, c16_n02_n44, c16_p27_p43, O06)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n27_p34, c16_p19_n39, c16_n11_p43, c16_p02_n45, c16_p07_p45, c16_n15_n44, c16_p23_p41, c16_n30_n36, O07)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n36_p30, c16_p41_n23, c16_n44_p15, c16_p45_n07, c16_n45_n02, c16_p43_p11, c16_n39_n19, c16_p34_p27, O08)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n43_p27, c16_p44_n02, c16_n30_n23, c16_p07_p41, c16_p19_n45, c16_n39_p34, c16_p45_n11, c16_n36_n15, O09)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n45_p23, c16_p27_p19, c16_p15_n45, c16_n44_p30, c16_p34_p11, c16_p07_n43, c16_n41_p36, c16_p39_p02, O10)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n44_p19, c16_n02_p36, c16_p45_n34, c16_n15_n23, c16_n39_p43, c16_p30_p07, c16_p27_n45, c16_n41_p11, O11)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n39_p15, c16_n30_p45, c16_p27_p02, c16_p41_n44, c16_n11_n19, c16_n45_p36, c16_n07_p34, c16_p43_n23, O12)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n30_p11, c16_n45_p43, c16_n19_p36, c16_p23_n02, c16_p45_n39, c16_p27_n41, c16_n15_n07, c16_n44_p34, O13)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n19_p07, c16_n39_p30, c16_n45_p44, c16_n36_p43, c16_n15_p27, c16_p11_p02, c16_p34_n23, c16_p45_n41, O14)
            COMPUTE_ROW(T_00_00, T_00_01, T_00_02, T_00_03, T_00_04, T_00_05, T_00_06, T_00_07, \
                c16_n07_p02, c16_n15_p11, c16_n23_p19, c16_n30_p27, c16_n36_p34, c16_n41_p39, c16_n44_p43, c16_n45_p45, O15)

#undef COMPUTE_ROW
        }

        src00 = _mm_load_si128((const __m128i*)&src[0 * i_src + i]);
        src02 = _mm_load_si128((const __m128i*)&src[2 * i_src + i]);
        src04 = _mm_load_si128((const __m128i*)&src[4 * i_src + i]);
        src06 = _mm_load_si128((const __m128i*)&src[6 * i_src + i]);
        src08 = _mm_load_si128((const __m128i*)&src[8 * i_src + i]);
        src10 = _mm_load_si128((const __m128i*)&src[10 * i_src + i]);
        src12 = _mm_load_si128((const __m128i*)&src[12 * i_src + i]);
        src14 = _mm_load_si128((const __m128i*)&src[14 * i_src + i]);
        src16 = _mm_load_si128((const __m128i*)&src[16 * i_src + i]);
        src18 = _mm_load_si128((const __m128i*)&src[18 * i_src + i]);
        src20 = _mm_load_si128((const __m128i*)&src[20 * i_src + i]);
        src22 = _mm_load_si128((const __m128i*)&src[22 * i_src + i]);
        src24 = _mm_load_si128((const __m128i*)&src[24 * i_src + i]);
        src26 = _mm_load_si128((const __m128i*)&src[26 * i_src + i]);
        src28 = _mm_load_si128((const __m128i*)&src[28 * i_src + i]);
        src30 = _mm_load_si128((const __m128i*)&src[30 * i_src + i]);

        ss00 = _mm_unpacklo_epi16(src02, src06);
        ss01 = _mm_unpacklo_epi16(src10, src14);
        ss02 = _mm_unpacklo_epi16(src18, src22);
        ss03 = _mm_unpacklo_epi16(src26, src30);
        ss04 = _mm_unpacklo_epi16(src04, src12);
        ss05 = _mm_unpacklo_epi16(src20, src28);
        ss06 = _mm_unpacklo_epi16(src08, src24);
        ss07 = _mm_unpacklo_epi16(src00, src16);

        ss08 = _mm_unpackhi_epi16(src02, src06);
        ss09 = _mm_unpackhi_epi16(src10, src14);
        ss10 = _mm_unpackhi_epi16(src18, src22);
        ss11 = _mm_unpackhi_epi16(src26, src30);
        ss12 = _mm_unpackhi_epi16(src04, src12);
        ss13 = _mm_unpackhi_epi16(src20, src28);
        ss14 = _mm_unpackhi_epi16(src08, src24);
        ss15 = _mm_unpackhi_epi16(src00, src16);

        {
            const __m256i T_00_08 = _mm256_set_m128i(ss08, ss00);
            const __m256i T_00_09 = _mm256_set_m128i(ss09, ss01);
            const __m256i T_00_10 = _mm256_set_m128i(ss10, ss02);
            const __m256i T_00_11 = _mm256_set_m128i(ss11, ss03);
            const __m256i T_00_12 = _mm256_set_m128i(ss12, ss04);
            const __m256i T_00_13 = _mm256_set_m128i(ss13, ss05);
            const __m256i T_00_14 = _mm256_set_m128i(ss14, ss06);
            const __m256i T_00_15 = _mm256_set_m128i(ss15, ss07);

#define COMPUTE_ROW(row0206, row1014, row1822, row2630, c0206, c1014, c1822, c2630, row) \
            t0 = _mm256_madd_epi16(row0206, c0206); \
            t1 = _mm256_madd_epi16(row1014, c1014); \
            t2 = _mm256_madd_epi16(row1822, c1822); \
            t3 = _mm256_madd_epi16(row2630, c2630); \
	        t0 = _mm256_add_epi32(t0, t1); \
	        t2 = _mm256_add_epi32(t2, t3); \
	        row = _mm256_add_epi32(t0, t2);

            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_p43_p45, c16_p35_p40, c16_p21_p29, c16_p04_p13, EO0)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_p29_p43, c16_n21_p04, c16_n45_n40, c16_n13_n35, EO1)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_p04_p40, c16_n43_n35, c16_p29_n13, c16_p21_p45, EO2)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n21_p35, c16_p04_n43, c16_p13_p45, c16_n29_n40, EO3)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n40_p29, c16_p45_n13, c16_n43_n04, c16_p35_p21, EO4)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n45_p21, c16_p13_p29, c16_p35_n43, c16_n40_p04, EO5)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n35_p13, c16_n40_p45, c16_p04_p21, c16_p43_n29, EO6)
            COMPUTE_ROW(T_00_08, T_00_09, T_00_10, T_00_11, c16_n13_p04, c16_n29_p21, c16_n40_p35, c16_n45_p43, EO7)

#undef COMPUTE_ROW

            {
                const __m256i EEO0 = _mm256_add_epi32(_mm256_madd_epi16(T_00_12, c16_p38_p44), _mm256_madd_epi16(T_00_13, c16_p09_p25));
                const __m256i EEO1 = _mm256_add_epi32(_mm256_madd_epi16(T_00_12, c16_n09_p38), _mm256_madd_epi16(T_00_13, c16_n25_n44));
                const __m256i EEO2 = _mm256_add_epi32(_mm256_madd_epi16(T_00_12, c16_n44_p25), _mm256_madd_epi16(T_00_13, c16_p38_p09));
                const __m256i EEO3 = _mm256_add_epi32(_mm256_madd_epi16(T_00_12, c16_n25_p09), _mm256_madd_epi16(T_00_13, c16_n44_p38));

                const __m256i EEEO0 = _mm256_madd_epi16(T_00_14, c16_p17_p42);
                const __m256i EEEO1 = _mm256_madd_epi16(T_00_14, c16_n42_p17);

                const __m256i EEEE0 = _mm256_madd_epi16(T_00_15, c16_p32_p32);
                const __m256i EEEE1 = _mm256_madd_epi16(T_00_15, c16_n32_p32);

                const __m256i EEE0 = _mm256_add_epi32(EEEE0, EEEO0);          // EEE0 = EEEE0 + EEEO0
                const __m256i EEE1 = _mm256_add_epi32(EEEE1, EEEO1);          // EEE1 = EEEE1 + EEEO1
                const __m256i EEE3 = _mm256_sub_epi32(EEEE0, EEEO0);          // EEE2 = EEEE0 - EEEO0
                const __m256i EEE2 = _mm256_sub_epi32(EEEE1, EEEO1);          // EEE3 = EEEE1 - EEEO1

                const __m256i EE0 = _mm256_add_epi32(EEE0, EEO0);          // EE0 = EEE0 + EEO0
                const __m256i EE1 = _mm256_add_epi32(EEE1, EEO1);          // EE1 = EEE1 + EEO1
                const __m256i EE2 = _mm256_add_epi32(EEE2, EEO2);          // EE2 = EEE0 + EEO0
                const __m256i EE3 = _mm256_add_epi32(EEE3, EEO3);          // EE3 = EEE1 + EEO1
                const __m256i EE7 = _mm256_sub_epi32(EEE0, EEO0);          // EE7 = EEE0 - EEO0
                const __m256i EE6 = _mm256_sub_epi32(EEE1, EEO1);          // EE6 = EEE1 - EEO1
                const __m256i EE5 = _mm256_sub_epi32(EEE2, EEO2);          // EE5 = EEE0 - EEO0
                const __m256i EE4 = _mm256_sub_epi32(EEE3, EEO3);          // EE4 = EEE1 - EEO1

                const __m256i E0 = _mm256_add_epi32(EE0, EO0);          // E0 = EE0 + EO0
                const __m256i E1 = _mm256_add_epi32(EE1, EO1);          // E1 = EE1 + EO1
                const __m256i E2 = _mm256_add_epi32(EE2, EO2);          // E2 = EE2 + EO2
                const __m256i E3 = _mm256_add_epi32(EE3, EO3);          // E3 = EE3 + EO3
                const __m256i E4 = _mm256_add_epi32(EE4, EO4);          // E4 =
                const __m256i E5 = _mm256_add_epi32(EE5, EO5);          // E5 =
                const __m256i E6 = _mm256_add_epi32(EE6, EO6);          // E6 =
                const __m256i E7 = _mm256_add_epi32(EE7, EO7);          // E7 =
                const __m256i EF = _mm256_sub_epi32(EE0, EO0);          // EF = EE0 - EO0
                const __m256i EE = _mm256_sub_epi32(EE1, EO1);          // EE = EE1 - EO1
                const __m256i ED = _mm256_sub_epi32(EE2, EO2);          // ED = EE2 - EO2
                const __m256i EC = _mm256_sub_epi32(EE3, EO3);          // EC = EE3 - EO3
                const __m256i EB = _mm256_sub_epi32(EE4, EO4);          // EB =
                const __m256i EA = _mm256_sub_epi32(EE5, EO5);          // EA =
                const __m256i E9 = _mm256_sub_epi32(EE6, EO6);          // E9 =
                const __m256i E8 = _mm256_sub_epi32(EE7, EO7);          // E8 =

                const __m256i T10 = _mm256_add_epi32(E0, c32_off);         // E0 + off
                const __m256i T11 = _mm256_add_epi32(E1, c32_off);         // E1 + off
                const __m256i T12 = _mm256_add_epi32(E2, c32_off);         // E2 + off
                const __m256i T13 = _mm256_add_epi32(E3, c32_off);         // E3 + off
                const __m256i T14 = _mm256_add_epi32(E4, c32_off);         // E4 + off
                const __m256i T15 = _mm256_add_epi32(E5, c32_off);         // E5 + off
                const __m256i T16 = _mm256_add_epi32(E6, c32_off);         // E6 + off
                const __m256i T17 = _mm256_add_epi32(E7, c32_off);         // E7 + off
                const __m256i T18 = _mm256_add_epi32(E8, c32_off);         // E8 + off
                const __m256i T19 = _mm256_add_epi32(E9, c32_off);         // E9 + off
                const __m256i T1A = _mm256_add_epi32(EA, c32_off);         // E10 + off
                const __m256i T1B = _mm256_add_epi32(EB, c32_off);         // E11 + off
                const __m256i T1C = _mm256_add_epi32(EC, c32_off);         // E12 + off
                const __m256i T1D = _mm256_add_epi32(ED, c32_off);         // E13 + off
                const __m256i T1E = _mm256_add_epi32(EE, c32_off);         // E14 + off
                const __m256i T1F = _mm256_add_epi32(EF, c32_off);         // E15 + off

                __m256i T2_00 = _mm256_add_epi32(T10, O00);          // E0 + O0 + off
                __m256i T2_01 = _mm256_add_epi32(T11, O01);          // E1 + O1 + off
                __m256i T2_02 = _mm256_add_epi32(T12, O02);          // E2 + O2 + off
                __m256i T2_03 = _mm256_add_epi32(T13, O03);          // E3 + O3 + off
                __m256i T2_04 = _mm256_add_epi32(T14, O04);          // E4
                __m256i T2_05 = _mm256_add_epi32(T15, O05);          // E5
                __m256i T2_06 = _mm256_add_epi32(T16, O06);          // E6
                __m256i T2_07 = _mm256_add_epi32(T17, O07);          // E7
                __m256i T2_08 = _mm256_add_epi32(T18, O08);          // E8
                __m256i T2_09 = _mm256_add_epi32(T19, O09);          // E9
                __m256i T2_10 = _mm256_add_epi32(T1A, O10);          // E10
                __m256i T2_11 = _mm256_add_epi32(T1B, O11);          // E11
                __m256i T2_12 = _mm256_add_epi32(T1C, O12);          // E12
                __m256i T2_13 = _mm256_add_epi32(T1D, O13);          // E13
                __m256i T2_14 = _mm256_add_epi32(T1E, O14);          // E14
                __m256i T2_15 = _mm256_add_epi32(T1F, O15);          // E15
                __m256i T2_31 = _mm256_sub_epi32(T10, O00);          // E0 - O0 + off
                __m256i T2_30 = _mm256_sub_epi32(T11, O01);          // E1 - O1 + off
                __m256i T2_29 = _mm256_sub_epi32(T12, O02);          // E2 - O2 + off
                __m256i T2_28 = _mm256_sub_epi32(T13, O03);          // E3 - O3 + off
                __m256i T2_27 = _mm256_sub_epi32(T14, O04);          // E4
                __m256i T2_26 = _mm256_sub_epi32(T15, O05);          // E5
                __m256i T2_25 = _mm256_sub_epi32(T16, O06);          // E6
                __m256i T2_24 = _mm256_sub_epi32(T17, O07);          // E7
                __m256i T2_23 = _mm256_sub_epi32(T18, O08);          //
                __m256i T2_22 = _mm256_sub_epi32(T19, O09);          //
                __m256i T2_21 = _mm256_sub_epi32(T1A, O10);          //
                __m256i T2_20 = _mm256_sub_epi32(T1B, O11);          //
                __m256i T2_19 = _mm256_sub_epi32(T1C, O12);          //
                __m256i T2_18 = _mm256_sub_epi32(T1D, O13);          //
                __m256i T2_17 = _mm256_sub_epi32(T1E, O14);          //
                __m256i T2_16 = _mm256_sub_epi32(T1F, O15);          //

                T2_00 = _mm256_srai_epi32(T2_00, shift);             // [30 20 10 00]
                T2_01 = _mm256_srai_epi32(T2_01, shift);             // [31 21 11 01]
                T2_02 = _mm256_srai_epi32(T2_02, shift);             // [32 22 12 02]
                T2_03 = _mm256_srai_epi32(T2_03, shift);             // [33 23 13 03]
                T2_04 = _mm256_srai_epi32(T2_04, shift);             // [33 24 14 04]
                T2_05 = _mm256_srai_epi32(T2_05, shift);             // [35 25 15 05]
                T2_06 = _mm256_srai_epi32(T2_06, shift);             // [36 26 16 06]
                T2_07 = _mm256_srai_epi32(T2_07, shift);             // [37 27 17 07]
                T2_08 = _mm256_srai_epi32(T2_08, shift);             // [30 20 10 00] x8
                T2_09 = _mm256_srai_epi32(T2_09, shift);             // [31 21 11 01] x9
                T2_10 = _mm256_srai_epi32(T2_10, shift);             // [32 22 12 02] xA
                T2_11 = _mm256_srai_epi32(T2_11, shift);             // [33 23 13 03] xB
                T2_12 = _mm256_srai_epi32(T2_12, shift);             // [33 24 14 04] xC
                T2_13 = _mm256_srai_epi32(T2_13, shift);             // [35 25 15 05] xD
                T2_14 = _mm256_srai_epi32(T2_14, shift);             // [36 26 16 06] xE
                T2_15 = _mm256_srai_epi32(T2_15, shift);             // [37 27 17 07] xF
                T2_16 = _mm256_srai_epi32(T2_16, shift);             // [30 20 10 00]
                T2_17 = _mm256_srai_epi32(T2_17, shift);             // [31 21 11 01]
                T2_18 = _mm256_srai_epi32(T2_18, shift);             // [32 22 12 02]
                T2_19 = _mm256_srai_epi32(T2_19, shift);             // [33 23 13 03]
                T2_20 = _mm256_srai_epi32(T2_20, shift);             // [33 24 14 04]
                T2_21 = _mm256_srai_epi32(T2_21, shift);             // [35 25 15 05]
                T2_22 = _mm256_srai_epi32(T2_22, shift);             // [36 26 16 06]
                T2_23 = _mm256_srai_epi32(T2_23, shift);             // [37 27 17 07]
                T2_24 = _mm256_srai_epi32(T2_24, shift);             // [30 20 10 00] x8
                T2_25 = _mm256_srai_epi32(T2_25, shift);             // [31 21 11 01] x9
                T2_26 = _mm256_srai_epi32(T2_26, shift);             // [32 22 12 02] xA
                T2_27 = _mm256_srai_epi32(T2_27, shift);             // [33 23 13 03] xB
                T2_28 = _mm256_srai_epi32(T2_28, shift);             // [33 24 14 04] xC
                T2_29 = _mm256_srai_epi32(T2_29, shift);             // [35 25 15 05] xD
                T2_30 = _mm256_srai_epi32(T2_30, shift);             // [36 26 16 06] xE
                T2_31 = _mm256_srai_epi32(T2_31, shift);             // [37 27 17 07] xF

                //transpose 32x8 -> 8x32.
                TRANSPOSE_16x8_32BIT_16BIT(T2_00, T2_01, T2_02, T2_03, T2_04, T2_05, T2_06, T2_07,
                    T2_08, T2_09, T2_10, T2_11, T2_12, T2_13, T2_14, T2_15, res00, res02, res04, res06, res08, res10, res12, res14);
                TRANSPOSE_16x8_32BIT_16BIT(T2_16, T2_17, T2_18, T2_19, T2_20, T2_21, T2_22, T2_23,
                    T2_24, T2_25, T2_26, T2_27, T2_28, T2_29, T2_30, T2_31, res01, res03, res05, res07, res09, res11, res13, res15);
                
            }
            if (bit_depth != MAX_TX_DYNAMIC_RANGE) {
                __m256i max_val = _mm256_set1_epi16((1 << bit_depth) - 1);
                __m256i min_val = _mm256_set1_epi16(-(1 << bit_depth));

                res00 = _mm256_min_epi16(res00, max_val);
                res01 = _mm256_min_epi16(res01, max_val);
                res02 = _mm256_min_epi16(res02, max_val);
                res03 = _mm256_min_epi16(res03, max_val);
                res00 = _mm256_max_epi16(res00, min_val);
                res01 = _mm256_max_epi16(res01, min_val);
                res02 = _mm256_max_epi16(res02, min_val);
                res03 = _mm256_max_epi16(res03, min_val);
                res04 = _mm256_min_epi16(res04, max_val);
                res05 = _mm256_min_epi16(res05, max_val);
                res06 = _mm256_min_epi16(res06, max_val);
                res07 = _mm256_min_epi16(res07, max_val);
                res04 = _mm256_max_epi16(res04, min_val);
                res05 = _mm256_max_epi16(res05, min_val);
                res06 = _mm256_max_epi16(res06, min_val);
                res07 = _mm256_max_epi16(res07, min_val);

                res08 = _mm256_min_epi16(res08, max_val);
                res09 = _mm256_min_epi16(res09, max_val);
                res10 = _mm256_min_epi16(res10, max_val);
                res11 = _mm256_min_epi16(res11, max_val);
                res08 = _mm256_max_epi16(res08, min_val);
                res09 = _mm256_max_epi16(res09, min_val);
                res10 = _mm256_max_epi16(res10, min_val);
                res11 = _mm256_max_epi16(res11, min_val);
                res12 = _mm256_min_epi16(res12, max_val);
                res13 = _mm256_min_epi16(res13, max_val);
                res14 = _mm256_min_epi16(res14, max_val);
                res15 = _mm256_min_epi16(res15, max_val);
                res12 = _mm256_max_epi16(res12, min_val);
                res13 = _mm256_max_epi16(res13, min_val);
                res14 = _mm256_max_epi16(res14, min_val);
                res15 = _mm256_max_epi16(res15, min_val);

            }
        }
        _mm256_store_si256((__m256i*)&dst[0  * 16], res00);
        _mm256_store_si256((__m256i*)&dst[1  * 16], res01);
        _mm256_store_si256((__m256i*)&dst[2  * 16], res02);
        _mm256_store_si256((__m256i*)&dst[3  * 16], res03);
        _mm256_store_si256((__m256i*)&dst[4  * 16], res04);
        _mm256_store_si256((__m256i*)&dst[5  * 16], res05);
        _mm256_store_si256((__m256i*)&dst[6  * 16], res06);
        _mm256_store_si256((__m256i*)&dst[7  * 16], res07);
        _mm256_store_si256((__m256i*)&dst[8  * 16], res08);
        _mm256_store_si256((__m256i*)&dst[9  * 16], res09);
        _mm256_store_si256((__m256i*)&dst[10 * 16], res10);
        _mm256_store_si256((__m256i*)&dst[11 * 16], res11);
        _mm256_store_si256((__m256i*)&dst[12 * 16], res12);
        _mm256_store_si256((__m256i*)&dst[13 * 16], res13);
        _mm256_store_si256((__m256i*)&dst[14 * 16], res14);
        _mm256_store_si256((__m256i*)&dst[15 * 16], res15);

        dst += 8 * 32;  // 8rows
    }
}